

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_4::anon_unknown_2::ApplyN<unsigned_char>
               (PtexTriangleKernelIter *k,float *result,void *data,int nChan,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  iVar3 = k->v1;
  if (iVar3 != k->v2) {
    fVar1 = k->A;
    do {
      iVar5 = k->rowlen - iVar3;
      iVar2 = iVar5 - k->w2;
      if (iVar2 < k->u1) {
        iVar2 = k->u1;
      }
      iVar5 = iVar5 - k->w1;
      if (k->u2 < iVar5) {
        iVar5 = k->u2;
      }
      iVar5 = (iVar5 - iVar2) * nTxChan;
      if (0 < iVar5) {
        uVar7 = (long)((k->rowlen * iVar3 + iVar2) * nTxChan) + (long)data;
        uVar6 = (long)iVar5 + uVar7;
        fVar9 = (float)iVar2 - k->u;
        fVar8 = (float)iVar3 - k->v;
        fVar10 = fVar9 * k->A * fVar9 + (k->B * fVar9 + k->C * fVar8) * fVar8;
        fVar8 = (fVar9 + fVar9 + 1.0) * k->A + fVar8 * k->B;
        do {
          if (fVar10 < 1.0) {
            fVar9 = expf(fVar10 * -6.125);
            fVar9 = fVar9 * k->wscale;
            k->weight = k->weight + fVar9;
            if (0 < nChan) {
              uVar4 = 0;
              do {
                result[uVar4] = (float)*(byte *)(uVar7 + uVar4) * fVar9 + result[uVar4];
                uVar4 = uVar4 + 1;
              } while ((uint)nChan != uVar4);
            }
          }
          fVar10 = fVar10 + fVar8;
          fVar8 = fVar8 + fVar1 + fVar1;
          uVar7 = uVar7 + (long)nTxChan;
        } while (uVar7 < uVar6);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != k->v2);
  }
  return;
}

Assistant:

void ApplyN(PtexTriangleKernelIter& k, float* result, void* data, int nChan, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccumN<T>()(result, p, nChan, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }